

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_remove_if.c
# Opt level: O1

void linkedlist_remove_if
               (s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg,
               f_destroy_element destroy_element)

{
  s_linkedlist_node *psVar1;
  e_matcher_result eVar2;
  s_linkedlist_node *psVar3;
  s_linkedlist_node **ppsVar4;
  s_linkedlist_node *psVar5;
  s_linkedlist_node *__ptr;
  
  if (linked_list->head != (s_linkedlist_node *)0x0) {
    __ptr = linked_list->head;
    do {
      eVar2 = (*matcher)(__ptr->element,matcher_arg);
      if (eVar2 == E_MATCHER_RESULT_MATCH) {
        psVar1 = __ptr->previous;
        ppsVar4 = &psVar1->next;
        if (psVar1 == (s_linkedlist_node *)0x0) {
          ppsVar4 = &linked_list->head;
        }
        *ppsVar4 = __ptr->next;
        psVar5 = __ptr->next;
        psVar3 = psVar5;
        if (psVar5 == (s_linkedlist_node *)0x0) {
          psVar3 = (s_linkedlist_node *)&linked_list->tail;
        }
        psVar3->previous = psVar1;
        if (destroy_element != (f_destroy_element)0x0) {
          (*destroy_element)(psVar5->element);
        }
        free(__ptr);
        linked_list->size = linked_list->size - 1;
      }
      else {
        psVar5 = __ptr->next;
      }
      __ptr = psVar5;
    } while (psVar5 != (s_linkedlist_node *)0x0);
  }
  return;
}

Assistant:

void
linkedlist_remove_if(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg, f_destroy_element destroy_element) {
    s_linkedlist_node *node      = linked_list->head;
    s_linkedlist_node *to_delete = NULL;

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            if (node->previous == NULL) {
                linked_list->head = node->next;
            } else {
                node->previous->next = node->next;
            }

            if (node->next == NULL) {
                linked_list->tail = node->previous;
            } else {
                node->next->previous = node->previous;
            }

            to_delete = node;
            node      = to_delete->next;

            if (destroy_element != NULL) {
                destroy_element(node->element);
            }

            free(to_delete);
            linked_list->size -= 1;
        } else {
            node = node->next;
        }
    }
}